

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

Maybe<const_capnp::StructSchema::Field_&> __thiscall
kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::find<capnp::Text::Reader>
          (HashMap<kj::StringPtr,_capnp::StructSchema::Field> *this,Reader *key)

{
  Maybe<const_capnp::StructSchema::Field_&> MVar1;
  anon_class_1_0_00000001 local_29;
  Maybe<const_kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Entry_&> local_28;
  Reader *local_20;
  Reader *key_local;
  HashMap<kj::StringPtr,_capnp::StructSchema::Field> *this_local;
  
  local_20 = key;
  key_local = (Reader *)this;
  local_28 = Table<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Entry,kj::HashIndex<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Callbacks>>
             ::find<0ul,capnp::Text::Reader&>
                       ((Table<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Entry,kj::HashIndex<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Callbacks>>
                         *)this,key);
  MVar1 = Maybe<const_kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Entry_&>::
          map<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp____kj_map_h:363:30)>
                    (&local_28,&local_29);
  return (Maybe<const_capnp::StructSchema::Field_&>)MVar1.ptr;
}

Assistant:

kj::Maybe<const Value&> HashMap<Key, Value>::find(KeyLike&& key) const {
  return table.find(key).map([](const Entry& e) -> const Value& { return e.value; });
}